

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm.cpp
# Opt level: O0

int __thiscall ncnn::RMSNorm::forward_inplace(RMSNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *in_RSI;
  long lVar5;
  long in_RDI;
  float fVar6;
  int i_7;
  int i_6;
  float a_3;
  float rms_3;
  int i_5;
  float sqsum_3;
  float *ptr_3;
  int q_1;
  int j_5;
  int j_4;
  float a_2;
  float rms_2;
  int j_3;
  float sqsum_2;
  float *ptr_2;
  int i_4;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_2;
  int j_1;
  float a_1;
  float rms_1;
  int j;
  float sqsum_1;
  float *ptr_1;
  int i_3;
  int h;
  int w_1;
  int i_2;
  int i_1;
  float a;
  float rms;
  int i;
  float sqsum;
  float *ptr;
  int w;
  int dims;
  Mat *m_1;
  Mat *m;
  int local_358;
  int local_354;
  int local_348;
  float local_344;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2dc;
  float local_2d8;
  int local_278;
  int local_274;
  int local_260;
  int local_25c;
  int local_250;
  float local_24c;
  int local_23c;
  int local_230;
  int local_22c;
  int local_220;
  float local_21c;
  
  iVar1 = (int)in_RSI[5];
  if (iVar1 == 1) {
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = *in_RSI;
    local_21c = 0.0;
    for (local_220 = 0; local_220 < iVar4; local_220 = local_220 + 1) {
      local_21c = *(float *)(lVar5 + (long)local_220 * 4) * *(float *)(lVar5 + (long)local_220 * 4)
                  + local_21c;
    }
    fVar6 = 1.0 / SQRT(local_21c / (float)iVar4 + *(float *)(in_RDI + 0xd4));
    if (*(int *)(in_RDI + 0xd8) == 0) {
      for (local_230 = 0; local_230 < iVar4; local_230 = local_230 + 1) {
        *(float *)(lVar5 + (long)local_230 * 4) = *(float *)(lVar5 + (long)local_230 * 4) * fVar6;
      }
    }
    else {
      for (local_22c = 0; local_22c < iVar4; local_22c = local_22c + 1) {
        *(float *)(lVar5 + (long)local_22c * 4) =
             *(float *)(lVar5 + (long)local_22c * 4) * fVar6 *
             *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_22c * 4);
      }
    }
  }
  if (iVar1 == 2) {
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = in_RSI[6];
    for (local_23c = 0; local_23c < (int)lVar5; local_23c = local_23c + 1) {
      lVar2 = *in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_23c * in_RSI[2];
      local_24c = 0.0;
      for (local_250 = 0; local_250 < iVar4; local_250 = local_250 + 1) {
        local_24c = *(float *)(lVar2 + (long)local_250 * 4) *
                    *(float *)(lVar2 + (long)local_250 * 4) + local_24c;
      }
      fVar6 = 1.0 / SQRT(local_24c / (float)iVar4 + *(float *)(in_RDI + 0xd4));
      if (*(int *)(in_RDI + 0xd8) == 0) {
        for (local_260 = 0; local_260 < iVar4; local_260 = local_260 + 1) {
          *(float *)(lVar2 + (long)local_260 * 4) = *(float *)(lVar2 + (long)local_260 * 4) * fVar6;
        }
      }
      else {
        for (local_25c = 0; local_25c < iVar4; local_25c = local_25c + 1) {
          *(float *)(lVar2 + (long)local_25c * 4) =
               *(float *)(lVar2 + (long)local_25c * 4) * fVar6 *
               *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_25c * 4);
        }
      }
    }
  }
  if (iVar1 == 3) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = in_RSI[6];
    lVar2 = in_RSI[7];
    iVar4 = iVar1 * (int)lVar5;
    if (*(int *)(in_RDI + 0xd0) == iVar1) {
      for (local_274 = 0; local_274 < (int)lVar2; local_274 = local_274 + 1) {
        for (local_278 = 0; local_278 < (int)lVar5; local_278 = local_278 + 1) {
          lVar3 = *in_RSI + in_RSI[8] * (long)local_274 * in_RSI[2] +
                  (long)*(int *)((long)in_RSI + 0x2c) * (long)local_278 * in_RSI[2];
          local_2d8 = 0.0;
          for (local_2dc = 0; local_2dc < iVar1; local_2dc = local_2dc + 1) {
            local_2d8 = *(float *)(lVar3 + (long)local_2dc * 4) *
                        *(float *)(lVar3 + (long)local_2dc * 4) + local_2d8;
          }
          fVar6 = 1.0 / SQRT(local_2d8 / (float)iVar1 + *(float *)(in_RDI + 0xd4));
          if (*(int *)(in_RDI + 0xd8) == 0) {
            for (local_2ec = 0; local_2ec < iVar1; local_2ec = local_2ec + 1) {
              *(float *)(lVar3 + (long)local_2ec * 4) =
                   *(float *)(lVar3 + (long)local_2ec * 4) * fVar6;
            }
          }
          else {
            for (local_2e8 = 0; local_2e8 < iVar1; local_2e8 = local_2e8 + 1) {
              *(float *)(lVar3 + (long)local_2e8 * 4) =
                   *(float *)(lVar3 + (long)local_2e8 * 4) * fVar6 *
                   *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_2e8 * 4);
            }
          }
        }
      }
    }
    else {
      for (local_2f0 = 0; local_2f0 < (int)lVar2; local_2f0 = local_2f0 + 1) {
        lVar5 = *in_RSI + in_RSI[8] * (long)local_2f0 * in_RSI[2];
        local_344 = 0.0;
        for (local_348 = 0; local_348 < iVar4; local_348 = local_348 + 1) {
          local_344 = *(float *)(lVar5 + (long)local_348 * 4) *
                      *(float *)(lVar5 + (long)local_348 * 4) + local_344;
        }
        fVar6 = 1.0 / SQRT(local_344 / (float)iVar4 + *(float *)(in_RDI + 0xd4));
        if (*(int *)(in_RDI + 0xd8) == 0) {
          for (local_358 = 0; local_358 < iVar4; local_358 = local_358 + 1) {
            *(float *)(lVar5 + (long)local_358 * 4) =
                 *(float *)(lVar5 + (long)local_358 * 4) * fVar6;
          }
        }
        else {
          for (local_354 = 0; local_354 < iVar4; local_354 = local_354 + 1) {
            *(float *)(lVar5 + (long)local_354 * 4) =
                 *(float *)(lVar5 + (long)local_354 * 4) * fVar6 *
                 *(float *)(*(long *)(in_RDI + 0xe0) + (long)local_354 * 4);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int RMSNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = x / sqrt(rms + eps) * gamma

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;
        // assert affine_size == w

        float* ptr = bottom_top_blob;

        float sqsum = 0.f;
        for (int i = 0; i < w; i++)
        {
            sqsum += ptr[i] * ptr[i];
        }
        float rms = sqrtf(sqsum / w + eps);

        float a = 1.f / rms;

        if (affine)
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = (ptr[i] * a) * gamma_data[i];
            }
        }
        else
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * a;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sqsum += ptr[j] * ptr[j];
            }
            float rms = sqrtf(sqsum / w + eps);

            float a = 1.f / rms;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a) * gamma_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);

                    float sqsum = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        sqsum += ptr[j] * ptr[j];
                    }
                    float rms = sqrtf(sqsum / w + eps);

                    float a = 1.f / rms;

                    if (affine)
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = (ptr[j] * a) * gamma_data[j];
                        }
                    }
                    else
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = ptr[j] * a;
                        }
                    }
                }
            }
        }
        else // if (affine_size == size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                float sqsum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sqsum += ptr[i] * ptr[i];
                }
                float rms = sqrtf(sqsum / size + eps);

                float a = 1.f / rms;

                if (affine)
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = (ptr[i] * a) * gamma_data[i];
                    }
                }
                else
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = ptr[i] * a;
                    }
                }
            }
        }
    }

    return 0;
}